

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int ActualMain(char *filename)

{
  FrameProtector *this;
  int iVar1;
  ostream *poVar2;
  long local_458;
  ifstream input;
  byte abStack_438 [488];
  undefined1 local_250 [8];
  ifstream prelude;
  byte abStack_230 [488];
  undefined1 local_48 [8];
  string prelude_file;
  FrameProtector __frame_prot;
  Sexp *activation;
  
  this = (FrameProtector *)((long)&prelude_file.field_2 + 8);
  FrameProtector::FrameProtector(this,"ActualMain");
  __frame_prot.protected_frame = (Frame *)0x0;
  FrameProtector::ProtectValue(this,(Sexp **)&__frame_prot,"activation");
  g_global_activation = GcHeap::AllocateActivation((Sexp *)0x0);
  __frame_prot.protected_frame = (Frame *)g_global_activation;
  FrameProtector::ProtectValue
            ((FrameProtector *)((long)&prelude_file.field_2 + 8),&g_global_activation,
             "g_global_activation");
  LoadBuiltins((Sexp *)__frame_prot.protected_frame);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                 &g_options.stdlib_path,'/');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                 "prelude.jet");
  std::__cxx11::string::~string((string *)local_250);
  std::ifstream::ifstream(local_250,(string *)local_48,_S_in);
  std::ifstream::ifstream(&local_458,(string *)&g_options.input_file,_S_in);
  if ((abStack_230[*(long *)((long)local_250 + -0x18)] & 5) == 0) {
    if ((abStack_438[*(long *)(local_458 + -0x18)] & 5) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"failed to open file: ");
      poVar2 = std::operator<<(poVar2,filename);
      goto LAB_00111ab8;
    }
    iVar1 = EvalFile((ifstream *)local_250,(Sexp *)__frame_prot.protected_frame);
    if (iVar1 == 0) {
      iVar1 = EvalFile((ifstream *)&local_458,(Sexp *)__frame_prot.protected_frame);
      goto LAB_00111ac3;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"failed to open prelude (");
    poVar2 = std::operator<<(poVar2,(string *)local_48);
    poVar2 = std::operator<<(poVar2,")");
LAB_00111ab8:
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  iVar1 = 1;
LAB_00111ac3:
  std::ifstream::~ifstream(&local_458);
  std::ifstream::~ifstream(local_250);
  std::__cxx11::string::~string((string *)local_48);
  FrameProtector::~FrameProtector((FrameProtector *)((long)&prelude_file.field_2 + 8));
  return iVar1;
}

Assistant:

int ActualMain(char *filename) {
  GC_HELPER_FRAME;
  GC_PROTECTED_LOCAL(activation);

  activation = GcHeap::AllocateActivation(nullptr);
  g_global_activation = activation;
  GC_PROTECT(g_global_activation);
  LoadBuiltins(activation);

  std::string prelude_file = g_options.stdlib_path + path_sep + "prelude.jet";
  std::ifstream prelude(prelude_file);
  std::ifstream input(g_options.input_file);

  if (prelude.fail()) {
    std::cerr << "failed to open prelude (" << prelude_file << ")" << std::endl;
    return 1;
  }

  if (input.fail()) {
    std::cerr << "failed to open file: " << filename << std::endl;
    return 1;
  }

  int exitCode = EvalFile(prelude, activation);
  if (exitCode != 0) {
    return exitCode;
  }

  return EvalFile(input, activation);
}